

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O1

bool AString_replaceCString
               (AString *str,char *old,size_t oldLen,char *rep,size_t newLen,size_t count)

{
  size_t __n;
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  char *cstr;
  void *__dest;
  size_t sVar4;
  size_t count_00;
  int iVar5;
  size_t index;
  size_t local_68;
  
  bVar3 = false;
  if (oldLen != 0 && (old != (char *)0x0 && str != (AString *)0x0)) {
    if (rep == (char *)0x0) {
      newLen = 0;
    }
    cstr = "";
    if (rep != (char *)0x0) {
      cstr = rep;
    }
    sVar1 = str->size;
    sVar2 = str->capacity;
    __dest = malloc(sVar2 + 1);
    __n = sVar1 + 1;
    memcpy(__dest,str->buffer,__n);
    if (str->size != 0) {
      index = 0;
      sVar4 = 0;
      local_68 = count;
      do {
        if (str->buffer[index] == old[sVar4]) {
          count_00 = sVar4 + 1;
          if (count_00 != oldLen) goto LAB_00154a0a;
          index = index - sVar4;
          bVar3 = AString_replaceRangeCString(str,index,count_00,cstr,newLen);
          if (bVar3 == false) {
            str->capacity = sVar2;
            str->size = sVar1;
            memcpy(str->buffer,__dest,__n);
            free(__dest);
            iVar5 = 1;
          }
          else {
            if (local_68 == 0) {
              count_00 = 0;
              local_68 = 0;
              goto LAB_00154a0a;
            }
            local_68 = local_68 - 1;
            if (local_68 != 0) goto LAB_00154a08;
            iVar5 = 5;
            local_68 = 0;
          }
        }
        else {
LAB_00154a08:
          count_00 = 0;
LAB_00154a0a:
          iVar5 = 0;
        }
        if (iVar5 != 0) {
          if (iVar5 != 5) {
            return false;
          }
          break;
        }
        index = index + 1;
        sVar4 = count_00;
      } while (index < str->size);
    }
    free(__dest);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

ACUTILS_HD_FUNC bool AString_replaceCString(struct AString *str, const char *old, size_t oldLen, const char *rep, size_t newLen, size_t count)
{
    size_t i, currentOldIndex = 0, tmpSize, tmpCapacity;
    char *tmp;
    if(str == nullptr || old == nullptr || oldLen == 0) {
        return false;
    } else if(rep == nullptr) {
        rep = "";
        newLen = 0;
    }
    tmpSize = str->size;
    tmpCapacity = str->capacity;
    tmp = (char*) malloc(tmpCapacity + 1);
    memcpy(tmp, str->buffer, tmpSize + 1);
    for(i = 0; i < str->size; ++i) {
        char c = str->buffer[i];
        if(c == old[currentOldIndex]) {
            if(++currentOldIndex == oldLen) {
                i -= currentOldIndex - 1;
                if(!AString_replaceRangeCString(str, i, currentOldIndex, rep, newLen)) {
                    str->capacity = tmpCapacity;
                    str->size = tmpSize;
                    memcpy(str->buffer, tmp, tmpSize + 1);
                    free(tmp);
                    return false;
                }
                if(count > 0 && --count == 0)
                    goto RETURN;
                currentOldIndex = 0;
            }
        } else {
            currentOldIndex = 0;
        }
    }
    RETURN:
    free(tmp);
    return true;
}